

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_randomness(int N,void *pBuf)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  sqlite3_mutex *psVar4;
  sqlite3_vfs *psVar5;
  long lVar6;
  long in_FS_OFFSET;
  bool bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  char k [256];
  uint local_138 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    if (sqlite3Config.bCoreMutex == '\0') {
      if (N < 1 || pBuf == (void *)0x0) {
LAB_00116867:
        sqlite3Prng.isInit = '\0';
        goto LAB_001167a5;
      }
      bVar7 = true;
      psVar4 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar4 = (*sqlite3Config.mutex.xMutexAlloc)(5);
      bVar7 = psVar4 == (sqlite3_mutex *)0x0;
      if (bVar7) {
        if (pBuf == (void *)0x0 || N < 1) goto LAB_00116867;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar4);
        if (pBuf == (void *)0x0 || N < 1) {
          sqlite3Prng.isInit = '\0';
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            (*sqlite3Config.mutex.xMutexLeave)(psVar4);
            return;
          }
          goto LAB_001169ba;
        }
        bVar7 = false;
      }
    }
    if (sqlite3Prng.isInit == '\0') {
      psVar5 = sqlite3_vfs_find((char *)0x0);
      uVar1 = sqlite3Config.iPrngSeed;
      sqlite3Prng.i = '\0';
      sqlite3Prng.j = '\0';
      if (psVar5 == (sqlite3_vfs *)0x0) {
        memset(local_138,0,0x100);
      }
      else if (sqlite3Config.iPrngSeed == 0) {
        (*psVar5->xRandomness)(psVar5,0x100,(char *)local_138);
      }
      else {
        memset(local_138,0,0x100);
        local_138[0] = uVar1;
      }
      uVar8 = '\0';
      uVar9 = '\x01';
      uVar10 = '\x02';
      uVar11 = '\x03';
      uVar12 = '\x04';
      uVar13 = '\x05';
      uVar14 = '\x06';
      uVar15 = '\a';
      uVar16 = '\b';
      uVar17 = '\t';
      uVar18 = '\n';
      uVar19 = '\v';
      uVar20 = '\f';
      uVar21 = '\r';
      uVar22 = '\x0e';
      uVar23 = '\x0f';
      lVar6 = 0;
      do {
        sqlite3Prng.s[lVar6] = uVar8;
        sqlite3Prng.s[lVar6 + 1] = uVar9;
        sqlite3Prng.s[lVar6 + 2] = uVar10;
        sqlite3Prng.s[lVar6 + 3] = uVar11;
        sqlite3Prng.s[lVar6 + 4] = uVar12;
        sqlite3Prng.s[lVar6 + 5] = uVar13;
        sqlite3Prng.s[lVar6 + 6] = uVar14;
        sqlite3Prng.s[lVar6 + 7] = uVar15;
        sqlite3Prng.s[lVar6 + 8] = uVar16;
        sqlite3Prng.s[lVar6 + 9] = uVar17;
        sqlite3Prng.s[lVar6 + 10] = uVar18;
        sqlite3Prng.s[lVar6 + 0xb] = uVar19;
        sqlite3Prng.s[lVar6 + 0xc] = uVar20;
        sqlite3Prng.s[lVar6 + 0xd] = uVar21;
        sqlite3Prng.s[lVar6 + 0xe] = uVar22;
        sqlite3Prng.s[lVar6 + 0xf] = uVar23;
        lVar6 = lVar6 + 0x10;
        uVar8 = uVar8 + '\x10';
        uVar9 = uVar9 + '\x10';
        uVar10 = uVar10 + '\x10';
        uVar11 = uVar11 + '\x10';
        uVar12 = uVar12 + '\x10';
        uVar13 = uVar13 + '\x10';
        uVar14 = uVar14 + '\x10';
        uVar15 = uVar15 + '\x10';
        uVar16 = uVar16 + '\x10';
        uVar17 = uVar17 + '\x10';
        uVar18 = uVar18 + '\x10';
        uVar19 = uVar19 + '\x10';
        uVar20 = uVar20 + '\x10';
        uVar21 = uVar21 + '\x10';
        uVar22 = uVar22 + '\x10';
        uVar23 = uVar23 + '\x10';
      } while (lVar6 != 0x100);
      lVar6 = 0;
      bVar2 = sqlite3Prng.j;
      do {
        bVar2 = bVar2 + *(char *)((long)local_138 + lVar6) + sqlite3Prng.s[lVar6];
        uVar8 = sqlite3Prng.s[bVar2];
        sqlite3Prng.s[bVar2] = sqlite3Prng.s[lVar6];
        sqlite3Prng.s[lVar6] = uVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x100);
      sqlite3Prng.isInit = '\x01';
    }
    else {
      bVar2 = sqlite3Prng.j;
    }
    lVar6 = 0;
    do {
      sqlite3Prng.i = sqlite3Prng.i + 1;
      uVar8 = sqlite3Prng.s[sqlite3Prng.i];
      bVar2 = bVar2 + uVar8;
      sqlite3Prng.s[sqlite3Prng.i] = sqlite3Prng.s[bVar2];
      sqlite3Prng.s[bVar2] = uVar8;
      *(uchar *)((long)pBuf + lVar6) = sqlite3Prng.s[(byte)(uVar8 + sqlite3Prng.s[sqlite3Prng.i])];
      lVar6 = lVar6 + 1;
    } while (N != (int)lVar6);
    sqlite3Prng.j = bVar2;
    if (!bVar7) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar4);
    }
  }
LAB_001167a5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001169ba:
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char t;
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.isInit = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.  The seed value does
  ** not need to contain a lot of randomness since we are not
  ** trying to do secure encryption or anything like that...
  **
  ** Nothing in this file or anywhere else in SQLite does any kind of
  ** encryption.  The RC4 algorithm is being used as a PRNG (pseudo-random
  ** number generator) not as an encryption device.
  */
  if( !wsdPrng.isInit ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    int i;
    char k[256];
    wsdPrng.j = 0;
    wsdPrng.i = 0;
    if( NEVER(pVfs==0) ){
      memset(k, 0, sizeof(k));
    }else{
      sqlite3OsRandomness(pVfs, 256, k);
    }
    for(i=0; i<256; i++){
      wsdPrng.s[i] = (u8)i;
    }
    for(i=0; i<256; i++){
      wsdPrng.j += wsdPrng.s[i] + k[i];
      t = wsdPrng.s[wsdPrng.j];
      wsdPrng.s[wsdPrng.j] = wsdPrng.s[i];
      wsdPrng.s[i] = t;
    }
    wsdPrng.isInit = 1;
  }

  assert( N>0 );
  do{
    wsdPrng.i++;
    t = wsdPrng.s[wsdPrng.i];
    wsdPrng.j += t;
    wsdPrng.s[wsdPrng.i] = wsdPrng.s[wsdPrng.j];
    wsdPrng.s[wsdPrng.j] = t;
    t += wsdPrng.s[wsdPrng.i];
    *(zBuf++) = wsdPrng.s[t];
  }while( --N );
  sqlite3_mutex_leave(mutex);
}